

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O2

int file_skip(output_file *out,int64_t cnt)

{
  FILE *__stream;
  int iVar1;
  __off64_t _Var2;
  int *piVar3;
  char *pcVar4;
  
  _Var2 = lseek64((int)out[1].cur_out_ptr,cnt,1);
  __stream = _stderr;
  iVar1 = 0;
  if (_Var2 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"error: %s: lseek64: %s\n","file_skip",pcVar4);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int file_skip(struct output_file* out, int64_t cnt) {
  off64_t ret;
  struct output_file_normal* outn = to_output_file_normal(out);

  ret = lseek64(outn->fd, cnt, SEEK_CUR);
  if (ret < 0) {
    error_errno("lseek64");
    return -1;
  }
  return 0;
}